

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

int expansion_sum(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = *f;
  if (elen < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)(uint)elen;
    uVar4 = 0;
    dVar7 = dVar6;
    do {
      dVar6 = dVar7 + e[uVar4];
      h[uVar4] = (dVar7 - (dVar6 - (dVar6 - dVar7))) + (e[uVar4] - (dVar6 - dVar7));
      uVar4 = uVar4 + 1;
      dVar7 = dVar6;
    } while ((uint)elen != uVar4);
  }
  iVar1 = (int)uVar2;
  h[uVar2] = dVar6;
  if (1 < flen) {
    uVar4 = 1;
    uVar3 = 0;
    do {
      dVar6 = f[uVar4];
      uVar5 = uVar3;
      dVar7 = dVar6;
      if (uVar4 <= uVar2) {
        do {
          dVar6 = dVar7 + h[uVar5 + 1];
          h[uVar5 + 1] = (dVar7 - (dVar6 - (dVar6 - dVar7))) + (h[uVar5 + 1] - (dVar6 - dVar7));
          uVar5 = uVar5 + 1;
          dVar7 = dVar6;
        } while (uVar5 < uVar2);
      }
      h[uVar2 + 1] = dVar6;
      uVar2 = uVar2 + 1;
      uVar4 = uVar4 + 1;
      uVar3 = uVar3 + 1;
    } while (uVar4 != (uint)flen);
    iVar1 = (int)uVar2;
  }
  return iVar1 + 1;
}

Assistant:

int expansion_sum(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* e and h can be the same, but f and h cannot. */
{
  REAL Q;
  INEXACT REAL Qnew;
  int findex, hindex, hlast;
  REAL hnow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  Q = f[0];
  for (hindex = 0; hindex < elen; hindex++) {
    hnow = e[hindex];
    Two_Sum(Q, hnow, Qnew, h[hindex]);
    Q = Qnew;
  }
  h[hindex] = Q;
  hlast = hindex;
  for (findex = 1; findex < flen; findex++) {
    Q = f[findex];
    for (hindex = findex; hindex <= hlast; hindex++) {
      hnow = h[hindex];
      Two_Sum(Q, hnow, Qnew, h[hindex]);
      Q = Qnew;
    }
    h[++hlast] = Q;
  }
  return hlast + 1;
}